

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O2

void ApplicativeHelper::getHeadAndAllArgs(TermList term,TermList *head,TermStack *args)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  TermList local_28;
  
  while( true ) {
    local_28._content = term._content;
    bVar1 = Kernel::TermList::isApplication(&local_28);
    if (!bVar1) break;
    Lib::Stack<Kernel::TermList>::push
              (args,(TermList)
                    *(uint64_t *)
                     (local_28._content + 0x10 +
                     (ulong)(*(uint *)(local_28._content + 0xc) & 0xfffffff) * 8));
    term._content =
         *(uint64_t *)
          (local_28._content + 0x18 + (ulong)(*(uint *)(local_28._content + 0xc) & 0xfffffff) * 8);
  }
  head->_content = (uint64_t)local_28;
  if ((local_28._content & 3) == 0) {
    uVar2 = (ulong)(*(uint *)(local_28._content + 0xc) & 0xfffffff);
    lVar3 = -uVar2;
    for (; lVar3 = lVar3 + 1, 0 < (int)uVar2; uVar2 = (ulong)((int)uVar2 - 1)) {
      Lib::Stack<Kernel::TermList>::push
                (args,(TermList)
                      *(uint64_t *)
                       (local_28._content + 0x28 +
                       ((ulong)(*(uint *)(local_28._content + 0xc) & 0xfffffff) + lVar3) * 8));
    }
  }
  return;
}

Assistant:

void ApplicativeHelper::getHeadAndAllArgs(TermList term, TermList& head, TermStack& args)
{
  while(term.isApplication()){
    args.push(*term.term()->nthArgument(3)); 
    term = *term.term()->nthArgument(2);
  }
  head = term;  
  if(term.isTerm()){
    unsigned arity = term.term()->arity();
    for(int i = arity-1; i >= 0; i--){
      args.push(*term.term()->nthArgument(i));
    }
  }
}